

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.c
# Opt level: O0

void ZSTD_buildFSETable(ZSTD_seqSymbol *dt,short *normalizedCounter,uint maxSymbolValue,
                       U32 *baseValue,U32 *nbAdditionalBits,uint tableLog)

{
  ushort uVar1;
  uint uVar2;
  ZSTD_seqSymbol ZVar3;
  uint uVar4;
  uint uVar5;
  byte bVar6;
  U32 nextState;
  U32 symbol;
  U32 u;
  int i;
  U32 position;
  U32 s_1;
  U32 step;
  U32 tableMask;
  U32 s;
  S16 largeLimit;
  ZSTD_seqSymbol_header DTableH;
  U32 highThreshold;
  U32 tableSize;
  U32 maxSV1;
  U16 symbolNext [53];
  ZSTD_seqSymbol *tableDecode;
  uint tableLog_local;
  U32 *nbAdditionalBits_local;
  U32 *baseValue_local;
  uint maxSymbolValue_local;
  short *normalizedCounter_local;
  ZSTD_seqSymbol *dt_local;
  
  bVar6 = (byte)tableLog;
  uVar4 = 1 << (bVar6 & 0x1f);
  DTableH.fastMode = uVar4 - 1;
  s = 1;
  for (step = 0; step < maxSymbolValue + 1; step = step + 1) {
    if (normalizedCounter[step] == -1) {
      dt[(ulong)DTableH.fastMode + 1].baseValue = step;
      *(undefined2 *)((long)&tableSize + (ulong)step * 2) = 1;
      DTableH.fastMode = DTableH.fastMode - 1;
    }
    else {
      if ((short)(1 << (bVar6 - 1 & 0x1f)) <= normalizedCounter[step]) {
        s = 0;
      }
      *(short *)((long)&tableSize + (ulong)step * 2) = normalizedCounter[step];
    }
  }
  ZVar3.baseValue = tableLog;
  ZVar3.nextState = (undefined2)s;
  ZVar3.nbAdditionalBits = s._2_1_;
  ZVar3.nbBits = s._3_1_;
  *dt = ZVar3;
  u = 0;
  for (i = 0; (uint)i < maxSymbolValue + 1; i = i + 1) {
    for (symbol = 0; (int)symbol < (int)normalizedCounter[(uint)i]; symbol = symbol + 1) {
      dt[(ulong)u + 1].baseValue = i;
      do {
        u = u + (uVar4 >> 1) + (uVar4 >> 3) + 3 & uVar4 - 1;
      } while (DTableH.fastMode < u);
    }
  }
  for (nextState = 0; nextState < uVar4; nextState = nextState + 1) {
    uVar2 = dt[(ulong)nextState + 1].baseValue;
    uVar1 = *(ushort *)((long)&tableSize + (ulong)uVar2 * 2);
    *(ushort *)((long)&tableSize + (ulong)uVar2 * 2) = uVar1 + 1;
    uVar5 = BIT_highbit32((uint)uVar1);
    dt[(ulong)nextState + 1].nbBits = bVar6 - (char)uVar5;
    dt[(ulong)nextState + 1].nextState =
         (uVar1 << (dt[(ulong)nextState + 1].nbBits & 0x1f)) - (short)uVar4;
    dt[(ulong)nextState + 1].nbAdditionalBits = (BYTE)nbAdditionalBits[uVar2];
    dt[(ulong)nextState + 1].baseValue = baseValue[uVar2];
  }
  return;
}

Assistant:

void
ZSTD_buildFSETable(ZSTD_seqSymbol* dt,
            const short* normalizedCounter, unsigned maxSymbolValue,
            const U32* baseValue, const U32* nbAdditionalBits,
            unsigned tableLog)
{
    ZSTD_seqSymbol* const tableDecode = dt+1;
    U16 symbolNext[MaxSeq+1];

    U32 const maxSV1 = maxSymbolValue + 1;
    U32 const tableSize = 1 << tableLog;
    U32 highThreshold = tableSize-1;

    /* Sanity Checks */
    assert(maxSymbolValue <= MaxSeq);
    assert(tableLog <= MaxFSELog);

    /* Init, lay down lowprob symbols */
    {   ZSTD_seqSymbol_header DTableH;
        DTableH.tableLog = tableLog;
        DTableH.fastMode = 1;
        {   S16 const largeLimit= (S16)(1 << (tableLog-1));
            U32 s;
            for (s=0; s<maxSV1; s++) {
                if (normalizedCounter[s]==-1) {
                    tableDecode[highThreshold--].baseValue = s;
                    symbolNext[s] = 1;
                } else {
                    if (normalizedCounter[s] >= largeLimit) DTableH.fastMode=0;
                    symbolNext[s] = normalizedCounter[s];
        }   }   }
        memcpy(dt, &DTableH, sizeof(DTableH));
    }

    /* Spread symbols */
    {   U32 const tableMask = tableSize-1;
        U32 const step = FSE_TABLESTEP(tableSize);
        U32 s, position = 0;
        for (s=0; s<maxSV1; s++) {
            int i;
            for (i=0; i<normalizedCounter[s]; i++) {
                tableDecode[position].baseValue = s;
                position = (position + step) & tableMask;
                while (position > highThreshold) position = (position + step) & tableMask;   /* lowprob area */
        }   }
        assert(position == 0); /* position must reach all cells once, otherwise normalizedCounter is incorrect */
    }

    /* Build Decoding table */
    {   U32 u;
        for (u=0; u<tableSize; u++) {
            U32 const symbol = tableDecode[u].baseValue;
            U32 const nextState = symbolNext[symbol]++;
            tableDecode[u].nbBits = (BYTE) (tableLog - BIT_highbit32(nextState) );
            tableDecode[u].nextState = (U16) ( (nextState << tableDecode[u].nbBits) - tableSize);
            assert(nbAdditionalBits[symbol] < 255);
            tableDecode[u].nbAdditionalBits = (BYTE)nbAdditionalBits[symbol];
            tableDecode[u].baseValue = baseValue[symbol];
    }   }
}